

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

void absl::lts_20250127::anon_unknown_1::AppendNumberUnit(string *out,int64_t n,DisplayUnit unit)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char *__s;
  char acStack_29 [9];
  
  uVar4 = 0xffffffff;
  uVar2 = 0;
  do {
    uVar1 = uVar2;
    acStack_29[uVar1 + 1] = (char)n + (char)(n / 10) * -10 + '0';
    uVar3 = n + 9;
    uVar2 = uVar1 - 1;
    uVar4 = uVar4 - 1;
    n = n / 10;
  } while (0x12 < uVar3);
  if ((int)uVar2 + 1 < 2) {
    __s = acStack_29 + uVar1 + 1;
  }
  else {
    __s = acStack_29 + (uVar2 - uVar4) + 1;
    memset(__s,0x30,uVar2 & 0xffffffff);
  }
  if (*__s != '0' || __s + 1 != acStack_29 + 2) {
    std::__cxx11::string::append((char *)out,(ulong)__s);
    std::__cxx11::string::append((char *)out,(ulong)unit.abbr._M_str);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, int64_t n, DisplayUnit unit) {
  char buf[sizeof("2562047788015216")];  // hours in max duration
  char* const ep = buf + sizeof(buf);
  char* bp = Format64(ep, 0, n);
  if (*bp != '0' || bp + 1 != ep) {
    out->append(bp, static_cast<size_t>(ep - bp));
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}